

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O2

int __thiscall lan::db::connect(db *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int __oflag;
  undefined4 in_register_00000034;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,(string *)CONCAT44(in_register_00000034,__fd));
  iVar1 = safe_file::open(&this->file,(char *)local_30,__oflag);
  std::__cxx11::string::~string(local_30);
  return iVar1;
}

Assistant:

bool db::connect(std::string filename){
            return file.open(filename);
        }